

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender-c.cpp
# Opt level: O1

duckdb_state
duckdb_append_default_to_chunk(duckdb_appender appender,duckdb_data_chunk chunk,idx_t col,idx_t row)

{
  pointer this;
  ErrorData error;
  
  if (chunk != (duckdb_data_chunk)0x0 && appender != (duckdb_appender)0x0) {
    this = duckdb::unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>::
           operator->((unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true> *)
                      appender);
    duckdb::Appender::AppendDefault(this,(DataChunk *)chunk,col,row);
  }
  return (uint)(chunk == (duckdb_data_chunk)0x0 || appender == (duckdb_appender)0x0);
}

Assistant:

duckdb_state duckdb_append_default_to_chunk(duckdb_appender appender, duckdb_data_chunk chunk, idx_t col, idx_t row) {
	if (!appender || !chunk) {
		return DuckDBError;
	}

	auto *appender_instance = reinterpret_cast<AppenderWrapper *>(appender);

	auto data_chunk = reinterpret_cast<duckdb::DataChunk *>(chunk);

	try {
		appender_instance->appender->AppendDefault(*data_chunk, col, row);
	} catch (std::exception &ex) {
		ErrorData error(ex);
		appender_instance->error = error.RawMessage();
		return DuckDBError;
	} catch (...) {
		return DuckDBError;
	}
	return DuckDBSuccess;
}